

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O1

int CBB_add_asn1_uint64_with_tag(CBB *cbb,uint64_t value,CBS_ASN1_TAG tag)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  anon_union_32_2_4f6aaa2e_for_u *paVar4;
  char cVar5;
  ulong uVar6;
  long lVar7;
  CBB child;
  CBB local_60;
  
  iVar3 = CBB_add_asn1(cbb,&local_60,tag);
  if (iVar3 != 0) {
    bVar1 = false;
    lVar7 = 0x38;
    do {
      uVar6 = value >> ((byte)lVar7 & 0x3f);
      if (bVar1) {
LAB_004c8301:
        iVar3 = cbb_add_u(&local_60,uVar6 & 0xff,1);
        cVar5 = (iVar3 == 0) * '\x02';
        bVar1 = true;
        bVar2 = false;
      }
      else {
        bVar2 = true;
        cVar5 = (char)uVar6;
        if (cVar5 != '\0') {
          if (cVar5 < '\0') {
            bVar1 = false;
            iVar3 = cbb_add_u(&local_60,0,1);
            if (iVar3 == 0) {
              cVar5 = '\x02';
              iVar3 = 0;
              goto LAB_004c8323;
            }
          }
          goto LAB_004c8301;
        }
        cVar5 = '\x05';
        bVar1 = false;
      }
LAB_004c8323:
      if ((cVar5 != '\x05') && (cVar5 != '\0')) goto LAB_004c8371;
      lVar7 = lVar7 + -8;
    } while (lVar7 != -8);
    cVar5 = '\x03';
LAB_004c8371:
    if (cVar5 != '\x02') {
      if (cVar5 != '\x03') {
        return iVar3;
      }
      if ((!bVar2) || (iVar3 = cbb_add_u(&local_60,0,1), iVar3 != 0)) {
        iVar3 = CBB_flush(cbb);
        return iVar3;
      }
    }
  }
  paVar4 = &cbb->u;
  if (cbb->is_child != '\0') {
    paVar4 = (anon_union_32_2_4f6aaa2e_for_u *)(paVar4->base).buf;
  }
  *(byte *)((long)paVar4 + 0x18) = *(byte *)((long)paVar4 + 0x18) | 2;
  cbb->child = (CBB *)0x0;
  return 0;
}

Assistant:

int CBB_add_asn1_uint64_with_tag(CBB *cbb, uint64_t value, CBS_ASN1_TAG tag) {
  CBB child;
  int started = 0;
  if (!CBB_add_asn1(cbb, &child, tag)) {
    goto err;
  }

  for (size_t i = 0; i < 8; i++) {
    uint8_t byte = (value >> 8 * (7 - i)) & 0xff;
    if (!started) {
      if (byte == 0) {
        // Don't encode leading zeros.
        continue;
      }
      // If the high bit is set, add a padding byte to make it
      // unsigned.
      if ((byte & 0x80) && !CBB_add_u8(&child, 0)) {
        goto err;
      }
      started = 1;
    }
    if (!CBB_add_u8(&child, byte)) {
      goto err;
    }
  }

  // 0 is encoded as a single 0, not the empty string.
  if (!started && !CBB_add_u8(&child, 0)) {
    goto err;
  }

  return CBB_flush(cbb);

err:
  cbb_on_error(cbb);
  return 0;
}